

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_load_store.c
# Opt level: O1

void multiple_load_store(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint32_t *puVar2;
  uint uVar3;
  access_type_t aVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int i;
  ulong uVar7;
  uint32_t *puVar8;
  uint32_t uVar9;
  bool bVar10;
  undefined8 local_38;
  
  uVar1 = thminstr->raw;
  uVar3 = uVar1 >> 8 & 7;
  uVar9 = state->r[uVar3];
  if ((uVar1 & 0xff) == 0) {
    if ((uVar1 >> 0xb & 1) == 0) {
      (*state->write_word)(uVar9,state->pc + 2,ACCESS_NONSEQUENTIAL);
    }
    else {
      uVar5 = (*state->read_word)(uVar9,ACCESS_NONSEQUENTIAL);
      uVar3 = uVar5 | 1;
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",0xf,(ulong)uVar3);
      }
      if (((uint)state->cpsr & 0x20) == 0) {
        uVar3 = uVar5 & 0xfffffffe;
      }
      set_pc(state,uVar3);
    }
    uVar9 = uVar9 + 0x40;
    bVar10 = true;
  }
  else if ((uVar1 >> 0xb & 1) == 0) {
    aVar4 = ACCESS_NONSEQUENTIAL;
    bVar10 = true;
    uVar7 = 0;
    uVar5 = uVar9;
    do {
      uVar3 = thminstr->raw & 0xff;
      if ((uVar3 >> ((uint)uVar7 & 0x1f) & 1) != 0) {
        if (uVar7 == (thminstr->raw >> 8 & 7)) {
          uVar6 = uVar9;
          if (!bVar10) {
            uVar6 = uVar9 + ((uVar3 * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) * 4;
          }
        }
        else {
          uVar6 = state->r[uVar7];
        }
        (*state->write_word)(uVar5,uVar6,aVar4);
        uVar5 = uVar5 + 4;
        aVar4 = ACCESS_SEQUENTIAL;
        bVar10 = false;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 8);
    bVar10 = true;
    uVar9 = uVar5;
  }
  else {
    local_38 = (ulong)CONCAT24(uVar1,1 << (sbyte)uVar3) & 0xffffffffff;
    puVar8 = state->r + 5;
    aVar4 = ACCESS_NONSEQUENTIAL;
    uVar7 = 0;
    do {
      if ((*(byte *)thminstr & (byte)(1 << ((byte)uVar7 & 0x1f))) != 0) {
        uVar5 = (*state->read_word)(uVar9,aVar4);
        if (2 < gba_log_verbosity) {
          printf("[DEBUG] Set r%d to 0x%08X\n",uVar7 & 0xffffffff,(ulong)uVar5);
        }
        puVar2 = puVar8 + -5;
        if (((state->cpsr).raw & 0x1f) == 0x11) {
          puVar2 = puVar8;
        }
        if (4 < uVar7 - 8) {
          puVar2 = puVar8 + -5;
        }
        *puVar2 = uVar5;
        uVar9 = uVar9 + 4;
        aVar4 = ACCESS_SEQUENTIAL;
      }
      uVar7 = uVar7 + 1;
      puVar8 = puVar8 + 1;
    } while (uVar7 != 9);
    bVar10 = (local_38._4_4_ & (uint)local_38) == 0;
  }
  if (bVar10) {
    uVar7 = (ulong)(*(byte *)((long)thminstr + 1) & 7);
    if (2 < gba_log_verbosity) {
      printf("[DEBUG] Set r%d to 0x%08X\n",uVar7,(ulong)uVar9);
    }
    state->r[uVar7] = uVar9;
  }
  return;
}

Assistant:

void multiple_load_store(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    multiple_load_store_t* instr = &thminstr->MULTIPLE_LOAD_STORE;
    word address = get_register(state, instr->rb);
    word base = address;
    bool writeback = true;
    access_type_t access = ACCESS_NONSEQUENTIAL;
    if (instr->rlist == 0) { // When rlist 0, save and load the program counter instead
        if (instr->l) {
            set_register(state, REG_PC, state->read_word(address, ACCESS_NONSEQUENTIAL) | 1);
        } else {
            state->write_word(address, state->pc + 2, ACCESS_NONSEQUENTIAL);
        }
        address += 0x40;
    }
    else if (instr->l) {
        if (instr->rlist & (1 << instr->rb)) {
            writeback = false; // Don't writeback to rb when we're also transferring to rb
        }
        for (int i = 0; i <= 8; i++) {
            if ((instr->rlist >> i) & 1) {
                set_register(state, i, state->read_word(address, access));
                access = ACCESS_SEQUENTIAL;
                address += 4;
            }
        }
    } else {
        bool first = true;
        for (int i = 0; i < 8; i++) {
            if ((instr->rlist >> i) & 1) {
                word value;
                if (i == instr->rb) {
                    if (first) {
                        value = base;
                    } else {
                        value = base + 4 * popcount(instr->rlist);
                    }
                } else {
                    value = get_register(state, i);
                }

                state->write_word(address, value, access);
                access = ACCESS_SEQUENTIAL;
                first = false;
                address += 4;
            }
        }
    }

    if (writeback) {
        set_register(state, instr->rb, address);
    }
}